

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  Expression *pEVar1;
  InputDeclaration *args_2;
  ReadStream *pRVar2;
  
  this_00 = this->newModule;
  pEVar1 = pool_ptr<soul::heart::Expression>::operator*
                     ((pool_ptr<soul::heart::Expression> *)(__fn + 0x20));
  pEVar1 = cloneExpression(this,pEVar1);
  args_2 = getRemappedInput(this,*(InputDeclaration **)(__fn + 0x28));
  pRVar2 = Module::
           allocate<soul::heart::ReadStream,soul::CodeLocation_const&,soul::heart::Expression&,soul::heart::InputDeclaration&>
                     (this_00,(CodeLocation *)(__fn + 8),pEVar1,args_2);
  return (int)pRVar2;
}

Assistant:

heart::ReadStream& clone (const heart::ReadStream& old)
    {
        return newModule.allocate<heart::ReadStream> (old.location,
                                                      cloneExpression (*old.target),
                                                      getRemappedInput (old.source));
    }